

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

HelicsEndpoint
helicsFederateRegisterGlobalEndpoint(HelicsFederate fed,char *name,char *type,HelicsError *err)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *puVar2;
  ulong uVar3;
  MessageFederate *pMVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  size_t sVar7;
  Endpoint *pEVar8;
  FedObject *pFVar9;
  ulong uVar10;
  pointer *__ptr;
  const_iterator __position;
  _Alloc_hider _Var11;
  _Alloc_hider _Var12;
  EndpointObject *pEVar13;
  FedObject *fedObj;
  string_view eptName;
  string_view type_00;
  __single_object end;
  EndpointObject *local_58;
  _Head_base<0UL,_helics::EndpointObject_*,_false> local_50;
  MessageFederate *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  getMessageFedSharedPtr(&local_48,(HelicsError *)fed);
  pMVar4 = local_48;
  if (local_48 == (MessageFederate *)0x0) {
    pEVar13 = (EndpointObject *)0x0;
  }
  else {
    local_58 = (EndpointObject *)operator_new(0x28);
    (local_58->fedptr).super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (local_58->fedptr).super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58->endPtr = (Endpoint *)0x0;
    local_58->fed = (FedObject *)0x0;
    *(undefined8 *)&local_58->valid = 0;
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var11 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      sVar6 = strlen(name);
      _Var11._M_p = name;
    }
    sVar7 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var12._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (type != (char *)0x0) {
      sVar7 = strlen(type);
      _Var12._M_p = type;
    }
    eptName._M_str = _Var11._M_p;
    eptName._M_len = sVar6;
    type_00._M_str = _Var12._M_p;
    type_00._M_len = sVar7;
    pEVar8 = helics::MessageFederate::registerGlobalEndpoint(pMVar4,eptName,type_00);
    p_Var5 = p_Stack_40;
    pMVar4 = local_48;
    local_58->endPtr = pEVar8;
    local_48 = (MessageFederate *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_58->fedptr).
           super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (local_58->fedptr).super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pMVar4;
    (local_58->fedptr).super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    pFVar9 = helics::getFedObject(fed,(HelicsError *)0x0);
    pEVar13 = local_58;
    local_58->fed = pFVar9;
    local_50._M_head_impl = local_58;
    local_58 = (EndpointObject *)0x0;
    pEVar13->valid = -0x4bac6b3e;
    pEVar13->fed = (FedObject *)fed;
    __position._M_current =
         *(unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> **)
          ((long)fed + 0x80);
    puVar2 = *(unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> **)
              ((long)fed + 0x88);
    if ((__position._M_current == puVar2) ||
       (iVar1 = (pEVar13->endPtr->super_Interface).handle.hid,
       ((InterfaceHandle *)
       ((long)&(puVar2[-1]._M_t.
                super___uniq_ptr_impl<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::EndpointObject_*,_std::default_delete<helics::EndpointObject>_>
                .super__Head_base<0UL,_helics::EndpointObject_*,_false>._M_head_impl)->endPtr->
               super_Interface + 0x10))->hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::EndpointObject,std::default_delete<helics::EndpointObject>>,std::allocator<std::unique_ptr<helics::EndpointObject,std::default_delete<helics::EndpointObject>>>>
      ::
      emplace_back<std::unique_ptr<helics::EndpointObject,std::default_delete<helics::EndpointObject>>>
                ((vector<std::unique_ptr<helics::EndpointObject,std::default_delete<helics::EndpointObject>>,std::allocator<std::unique_ptr<helics::EndpointObject,std::default_delete<helics::EndpointObject>>>>
                  *)((long)fed + 0x80),
                 (unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *
                 )&local_50);
    }
    else {
      uVar10 = (long)puVar2 - (long)__position._M_current >> 3;
      while (uVar3 = uVar10, 0 < (long)uVar3) {
        uVar10 = uVar3 >> 1;
        if (((InterfaceHandle *)
            ((long)&(__position._M_current[uVar10]._M_t.
                     super___uniq_ptr_impl<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::EndpointObject_*,_std::default_delete<helics::EndpointObject>_>
                     .super__Head_base<0UL,_helics::EndpointObject_*,_false>._M_head_impl)->endPtr->
                    super_Interface + 0x10))->hid <= iVar1) {
          __position._M_current = __position._M_current + uVar10 + 1;
          uVar10 = ~uVar10 + uVar3;
        }
      }
      std::
      vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
                        *)((long)fed + 0x80),__position,(value_type *)&local_50);
    }
    if (local_50._M_head_impl != (EndpointObject *)0x0) {
      std::default_delete<helics::EndpointObject>::operator()
                ((default_delete<helics::EndpointObject> *)&local_50,local_50._M_head_impl);
    }
    local_50._M_head_impl = (EndpointObject *)0x0;
    if (local_58 != (EndpointObject *)0x0) {
      std::default_delete<helics::EndpointObject>::operator()
                ((default_delete<helics::EndpointObject> *)&local_58,local_58);
    }
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return pEVar13;
}

Assistant:

HelicsEndpoint helicsFederateRegisterGlobalEndpoint(HelicsFederate fed, const char* name, const char* type, HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getMessageFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto end = std::make_unique<helics::EndpointObject>();
        end->endPtr = &fedObj->registerGlobalEndpoint(AS_STRING_VIEW(name), AS_STRING_VIEW(type));
        end->fedptr = std::move(fedObj);
        end->fed = helics::getFedObject(fed, nullptr);
        return addEndpoint(fed, std::move(end));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}